

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O2

void fm_eulerToQuat(float roll,float pitch,float yaw,float *quat)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  
  fVar4 = cosf(roll * 0.5);
  fVar5 = cosf(pitch * 0.5);
  fVar6 = cosf(yaw * 0.5);
  fVar7 = sinf(roll * 0.5);
  fVar8 = sinf(pitch * 0.5);
  fVar9 = sinf(yaw * 0.5);
  auVar10 = ZEXT416((uint)fVar4);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar5 * fVar9)),auVar10,
                           ZEXT416((uint)(fVar6 * fVar8)));
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar8 * fVar9)),ZEXT416((uint)fVar7),
                           ZEXT416((uint)(fVar5 * fVar6)));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar8 * fVar9)),auVar10,
                           ZEXT416((uint)(fVar5 * fVar6)));
  auVar10 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar8 * fVar7)),auVar10,
                            ZEXT416((uint)(fVar5 * fVar9)));
  *quat = auVar3._0_4_;
  quat[1] = auVar1._0_4_;
  quat[2] = auVar10._0_4_;
  quat[3] = auVar2._0_4_;
  return;
}

Assistant:

void fm_eulerToQuat(float roll,float pitch,float yaw,float *quat) // convert euler angles to quaternion.
{
	roll  *= 0.5f;
	pitch *= 0.5f;
	yaw   *= 0.5f;

	float cr = cosf(roll);
	float cp = cosf(pitch);
	float cy = cosf(yaw);

	float sr = sinf(roll);
	float sp = sinf(pitch);
	float sy = sinf(yaw);

	float cpcy = cp * cy;
	float spsy = sp * sy;
	float spcy = sp * cy;
	float cpsy = cp * sy;

	quat[0]   = ( sr * cpcy - cr * spsy);
	quat[1]   = ( cr * spcy + sr * cpsy);
	quat[2]   = ( cr * cpsy - sr * spcy);
	quat[3]   = cr * cpcy + sr * spsy;
}